

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QPoint __thiscall QVariant::toPoint(QVariant *this)

{
  QPoint QVar1;
  QVariant *in_stack_fffffffffffffff8;
  
  QVar1 = qvariant_cast<QPoint>(in_stack_fffffffffffffff8);
  return QVar1;
}

Assistant:

QPoint QVariant::toPoint() const
{
    return qvariant_cast<QPoint>(*this);
}